

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O1

idx_t duckdb::InitialNestedLoopJoin::Operation<unsigned_long,duckdb::GreaterThanEquals>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  bool bVar9;
  bool bVar10;
  UnifiedVectorFormat right_data;
  UnifiedVectorFormat left_data;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  uVar7 = *rpos;
  if (uVar7 < right_size) {
    psVar1 = (local_c0.sel)->sel_vector;
    iVar8 = 0;
    do {
      if (psVar1 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar1[uVar7];
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar9 = false;
      }
      else {
        bVar9 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0;
      }
      bVar10 = *lpos < left_size;
      if (bVar10) {
        if (iVar8 != 0x800) {
          psVar2 = lvector->sel_vector;
          psVar3 = rvector->sel_vector;
          psVar4 = (local_78.sel)->sel_vector;
          uVar5 = *lpos;
          do {
            uVar6 = uVar5;
            if (psVar4 != (sel_t *)0x0) {
              uVar6 = (ulong)psVar4[uVar5];
            }
            if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar10 = false;
            }
            else {
              bVar10 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0;
            }
            if ((!bVar10 && !bVar9) &&
               (*(ulong *)(local_c0.data + uVar7 * 8) <= *(ulong *)(local_78.data + uVar6 * 8))) {
              psVar2[iVar8] = (sel_t)uVar5;
              psVar3[iVar8] = (sel_t)*rpos;
              iVar8 = iVar8 + 1;
            }
            uVar6 = uVar5 + 1;
            *lpos = uVar6;
            if (left_size - 1 == uVar5) {
              bVar10 = false;
              goto LAB_00d0b2c7;
            }
            uVar5 = uVar6;
          } while (iVar8 != 0x800);
          bVar10 = uVar6 < left_size;
        }
      }
      else {
LAB_00d0b2c7:
        *lpos = 0;
      }
      if (bVar10) {
        iVar8 = 0x800;
        break;
      }
      uVar7 = *rpos + 1;
      *rpos = uVar7;
    } while (uVar7 < right_size);
  }
  else {
    iVar8 = 0;
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return iVar8;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		// initialize phase of nested loop join
		// fill lvector and rvector with matches from the base vectors
		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (; rpos < right_size; rpos++) {
			idx_t right_position = right_data.sel->get_index(rpos);
			bool right_is_valid = right_data.validity.RowIsValid(right_position);
			for (; lpos < left_size; lpos++) {
				if (result_count == STANDARD_VECTOR_SIZE) {
					// out of space!
					return result_count;
				}
				idx_t left_position = left_data.sel->get_index(lpos);
				bool left_is_valid = left_data.validity.RowIsValid(left_position);
				if (MATCH_OP::Operation(ldata[left_position], rdata[right_position], !left_is_valid, !right_is_valid)) {
					// emit tuple
					lvector.set_index(result_count, lpos);
					rvector.set_index(result_count, rpos);
					result_count++;
				}
			}
			lpos = 0;
		}
		return result_count;
	}